

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_function_expression.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::ExpressionBinder::BindAggregate
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,FunctionExpression *expr,
          AggregateFunctionCatalogEntry *function,idx_t depth)

{
  string local_48;
  
  (*this->_vptr_ExpressionBinder[0xd])(&local_48);
  BindUnsupportedExpression
            (__return_storage_ptr__,this,&expr->super_ParsedExpression,depth,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindAggregate(FunctionExpression &expr, AggregateFunctionCatalogEntry &function,
                                           idx_t depth) {
	return BindUnsupportedExpression(expr, depth, UnsupportedAggregateMessage());
}